

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

void __thiscall flatbuffers::Parser::SerializeStruct(Parser *this,StructDef *struct_def,Value *val)

{
  FlatBufferBuilder *this_00;
  uint uVar1;
  
  uVar1 = atot<unsigned_int>((val->constant)._M_dataplus._M_p);
  if ((long)(this->struct_stack_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)((this->struct_stack_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar1) == struct_def->bytesize) {
    this_00 = &this->builder_;
    FlatBufferBuilder::Align(this_00,struct_def->minalign);
    vector_downward::push
              (&this_00->buf_,
               (this->struct_stack_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + uVar1,struct_def->bytesize);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->struct_stack_,
               (long)(this->struct_stack_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)((this->struct_stack_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + struct_def->bytesize));
    FlatBufferBuilder::TrackField
              (this_00,(voffset_t)val->offset,
               ((int)(this->builder_).buf_.reserved_ - *(int *)&(this->builder_).buf_.cur_) +
               *(int *)&(this->builder_).buf_.buf_);
    return;
  }
  __assert_fail("struct_stack_.size() - off == struct_def.bytesize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/src/idl_parser.cpp"
                ,0x16f,"void flatbuffers::Parser::SerializeStruct(const StructDef &, const Value &)"
               );
}

Assistant:

void Parser::SerializeStruct(const StructDef &struct_def, const Value &val) {
  auto off = atot<uoffset_t>(val.constant.c_str());
  assert(struct_stack_.size() - off == struct_def.bytesize);
  builder_.Align(struct_def.minalign);
  builder_.PushBytes(&struct_stack_[off], struct_def.bytesize);
  struct_stack_.resize(struct_stack_.size() - struct_def.bytesize);
  builder_.AddStructOffset(val.offset, builder_.GetSize());
}